

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_AmrMesh.cpp
# Opt level: O2

void __thiscall amrex::AmrMesh::SetBoxArray(AmrMesh *this,int lev,BoxArray *ba_in)

{
  bool bVar1;
  
  this->num_setba = this->num_setba + 1;
  bVar1 = BoxArray::operator!=
                    ((this->grids).super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                     super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>._M_impl.
                     super__Vector_impl_data._M_start + lev,ba_in);
  if (bVar1) {
    BoxArray::operator=((this->grids).
                        super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                        super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
                        _M_impl.super__Vector_impl_data._M_start + lev,ba_in);
    return;
  }
  return;
}

Assistant:

void
AmrMesh::SetBoxArray (int lev, const BoxArray& ba_in) noexcept
{
    ++num_setba;
    if (grids[lev] != ba_in) grids[lev] = ba_in;
}